

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabelPrivate::clearContents(QLabelPrivate *this)

{
  QArrayData *pQVar1;
  QWidget *this_00;
  Data *pDVar2;
  long lVar3;
  
  if (this->control != (QWidgetTextControl *)0x0) {
    (**(code **)(*(long *)this->control + 0x20))();
  }
  this->control = (QWidgetTextControl *)0x0;
  this->field_0x340 = this->field_0x340 & 0xcf;
  if ((this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
      super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>.
      _M_engaged == true) {
    (this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
    super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>.
    _M_engaged = false;
    QPicture::~QPicture((QPicture *)&this->picture);
  }
  if ((this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_engaged == true) {
    (this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
    super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
    _M_engaged = false;
    QIcon::~QIcon((QIcon *)&this->icon);
  }
  (this->pixmapSize).wd = -1;
  (this->pixmapSize).ht = -1;
  if ((this->text).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->text).d.d)->super_QArrayData;
    (this->text).d.d = (Data *)0x0;
    (this->text).d.ptr = (char16_t *)0x0;
    (this->text).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  if (this->shortcutId != 0) {
    QWidget::releaseShortcut(this_00,this->shortcutId);
  }
  this->shortcutId = 0;
  lVar3 = 0;
  do {
    QObject::disconnect((Connection *)((long)&(this->movieConnections)._M_elems[0].d_ptr + lVar3));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x10);
  pDVar2 = (this->movie).wp.d;
  (this->movie).wp.d = (Data *)0x0;
  (this->movie).wp.value = (QObject *)0x0;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
  }
  if ((char)*(ushort *)&this->field_0x340 < '\0') {
    if ((*(ushort *)&this->field_0x340 & 0x40) == 0) {
      QWidget::unsetCursor(this_00);
    }
    else {
      QWidget::setCursor(this_00,&this->cursor);
    }
  }
  this->field_0x340 = this->field_0x340 & 0x3f;
  return;
}

Assistant:

void QLabelPrivate::clearContents()
{
    delete control;
    control = nullptr;
    isTextLabel = false;
    hasShortcut = false;

#ifndef QT_NO_PICTURE
    picture.reset();
#endif
    icon.reset();
    pixmapSize = QSize();

    text.clear();
    Q_Q(QLabel);
#ifndef QT_NO_SHORTCUT
    if (shortcutId)
        q->releaseShortcut(shortcutId);
    shortcutId = 0;
#endif
#if QT_CONFIG(movie)
    for (const auto &conn : std::as_const(movieConnections))
        QObject::disconnect(conn);
    movie = nullptr;
#endif
#ifndef QT_NO_CURSOR
    if (onAnchor) {
        if (validCursor)
            q->setCursor(cursor);
        else
            q->unsetCursor();
    }
    validCursor = false;
    onAnchor = false;
#endif
}